

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserTransform.cpp
# Opt level: O3

bool __thiscall
Rml::PropertyParserTransform::Scan
          (PropertyParserTransform *this,int *out_bytes_read,char *str,char *keyword,
          PropertyParser **parsers,NumericValue *args,int nargs)

{
  PropertyParser *pPVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  char *__s;
  char *pcVar8;
  ulong uVar9;
  String arg_heap;
  Property prop;
  char arg_stack [1024];
  int local_52c;
  ulong local_528;
  ulong local_520;
  long *local_518 [2];
  long local_508 [2];
  char *local_4f8;
  undefined8 local_4f0;
  char local_4e8;
  undefined7 uStack_4e7;
  ulong local_4d8;
  NumericValue *local_4d0;
  int *local_4c8;
  PropertyParser **local_4c0;
  undefined1 local_4b8 [32];
  size_t local_498;
  undefined8 local_490;
  Property local_488;
  char local_438 [1032];
  
  bVar7 = false;
  *out_bytes_read = 0;
  local_52c = 0;
  local_4c8 = out_bytes_read;
  local_4c0 = parsers;
  __isoc99_sscanf(str," %n",&local_52c);
  iVar3 = local_52c;
  pcVar8 = str + local_52c;
  sVar4 = strlen(keyword);
  iVar2 = bcmp(pcVar8,keyword,sVar4);
  if (iVar2 == 0) {
    pcVar8 = pcVar8 + (int)sVar4;
    local_52c = 0;
    __isoc99_sscanf(pcVar8," %n",&local_52c);
    local_520 = (ulong)local_52c;
    pcVar8 = pcVar8 + local_520;
    local_52c = 0;
    __isoc99_sscanf(pcVar8," ( %n",&local_52c);
    iVar2 = local_52c;
    bVar7 = false;
    if ((long)local_52c != 0) {
      pcVar8 = pcVar8 + local_52c;
      local_4f8 = &local_4e8;
      local_4f0 = 0;
      local_4e8 = '\0';
      sVar5 = strlen(pcVar8);
      local_4d0 = args;
      if (sVar5 < 0x400) {
        __s = local_438;
      }
      else {
        strlen(pcVar8);
        ::std::__cxx11::string::_M_replace((ulong)&local_4f8,0,(char *)0x0,(ulong)pcVar8);
        __s = local_4f8;
      }
      local_528 = (ulong)(uint)(iVar2 + (int)local_520 + (int)sVar4 + iVar3);
      if (0 < nargs) {
        local_4d8 = (ulong)(nargs - 1);
        local_520 = (ulong)(uint)nargs;
        uVar9 = 0;
        do {
          Property::Property(&local_488);
          local_52c = 0;
          bVar7 = false;
          __isoc99_sscanf(pcVar8," %[^,)] %n",__s,&local_52c);
          if (local_52c != 0) {
            pPVar1 = local_4c0[uVar9];
            local_518[0] = local_508;
            if (__s == (char *)0x0) {
              pcVar6 = (char *)0x1;
            }
            else {
              sVar4 = strlen(__s);
              pcVar6 = __s + sVar4;
            }
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_518,__s,pcVar6);
            local_4b8._0_8_ = local_4b8 + 0x18;
            local_4b8._16_8_ = 0;
            local_4b8._24_8_ = 0;
            local_498 = 0;
            local_490._0_4_ = 0x20;
            local_490._4_4_ = 0;
            local_4b8._8_8_ = local_4b8._0_8_;
            iVar3 = (*pPVar1->_vptr_PropertyParser[2])
                              (pPVar1,&local_488,(string *)local_518,
                               (Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_4b8);
            robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::destroy((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_4b8);
            if (local_518[0] != local_508) {
              operator_delete(local_518[0],local_508[0] + 1);
            }
            if ((char)iVar3 == '\0') {
LAB_0025a1db:
              bVar7 = false;
            }
            else {
              local_4b8._0_8_ = local_4b8._0_8_ & 0xffffffff00000000;
              Variant::GetInto<float,_0>(&local_488.value,(float *)local_4b8);
              local_4d0[uVar9].number = (float)local_4b8._0_4_;
              local_4d0[uVar9].unit = local_488.unit;
              pcVar8 = pcVar8 + local_52c;
              local_528 = (ulong)(uint)((int)local_528 + local_52c);
              bVar7 = true;
              if (uVar9 < local_4d8) {
                local_52c = 0;
                __isoc99_sscanf(pcVar8," , %n",&local_52c);
                if ((long)local_52c == 0) goto LAB_0025a1db;
                pcVar8 = pcVar8 + local_52c;
                local_528 = (ulong)(uint)((int)local_528 + local_52c);
              }
            }
          }
          if (local_488.source.
              super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_488.source.
                       super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          Variant::~Variant(&local_488.value);
          if (!bVar7) {
            bVar7 = false;
            goto LAB_0025a245;
          }
          uVar9 = uVar9 + 1;
        } while (local_520 != uVar9);
      }
      local_52c = 0;
      bVar7 = false;
      __isoc99_sscanf(pcVar8," ) %n",&local_52c);
      if (local_52c != 0) {
        iVar3 = local_52c + (int)local_528;
        *local_4c8 = iVar3;
        bVar7 = iVar3 != 0 && SCARRY4(local_52c,(int)local_528) == iVar3 < 0;
      }
LAB_0025a245:
      if (local_4f8 != &local_4e8) {
        operator_delete(local_4f8,CONCAT71(uStack_4e7,local_4e8) + 1);
      }
    }
  }
  return bVar7;
}

Assistant:

bool PropertyParserTransform::Scan(int& out_bytes_read, const char* str, const char* keyword, const PropertyParser** parsers, NumericValue* args,
	int nargs) const
{
	out_bytes_read = 0;
	int total_bytes_read = 0, bytes_read = 0;

	/* skip leading white space */
	bytes_read = 0;
	sscanf(str, " %n", &bytes_read);
	str += bytes_read;
	total_bytes_read += bytes_read;

	/* find the keyword */
	if (!memcmp(str, keyword, strlen(keyword)))
	{
		bytes_read = (int)strlen(keyword);
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	/* skip any white space */
	bytes_read = 0;
	sscanf(str, " %n", &bytes_read);
	str += bytes_read;
	total_bytes_read += bytes_read;

	/* find the opening brace */
	bytes_read = 0;
	if (sscanf(str, " ( %n", &bytes_read), bytes_read)
	{
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	/* use the quicker stack-based argument buffer, if possible */
	char* arg = nullptr;
	char arg_stack[1024];
	String arg_heap;
	if (strlen(str) < sizeof(arg_stack))
	{
		arg = arg_stack;
	}
	else
	{
		arg_heap = str;
		arg = &arg_heap[0];
	}

	/* parse the arguments */
	for (int i = 0; i < nargs; ++i)
	{
		Property prop;

		bytes_read = 0;
		if (sscanf(str, " %[^,)] %n", arg, &bytes_read), bytes_read && parsers[i]->ParseValue(prop, String(arg), ParameterMap()))
		{
			args[i].number = prop.value.Get<float>();
			args[i].unit = prop.unit;
			str += bytes_read;
			total_bytes_read += bytes_read;
		}
		else
		{
			return false;
		}

		/* find the comma */
		if (i < nargs - 1)
		{
			bytes_read = 0;
			if (sscanf(str, " , %n", &bytes_read), bytes_read)
			{
				str += bytes_read;
				total_bytes_read += bytes_read;
			}
			else
			{
				return false;
			}
		}
	}

	/* find the closing brace */
	bytes_read = 0;
	if (sscanf(str, " ) %n", &bytes_read), bytes_read)
	{
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	out_bytes_read = total_bytes_read;
	return total_bytes_read > 0;
}